

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ZSTD_compressionParameters *cParams;
  int *iEnd;
  int *piVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  U32 *pUVar7;
  undefined8 uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  U32 UVar12;
  U32 UVar13;
  BYTE *iStart;
  int *ilimit_w;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  BYTE *pBVar17;
  int *mEnd;
  BYTE *pBVar18;
  BYTE *pBVar19;
  int *piVar20;
  uint uVar21;
  ulong uVar22;
  int *ip;
  long lVar23;
  int *piVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  seqDef *psVar28;
  bool bVar29;
  U32 local_114;
  U32 local_fc;
  int local_a4;
  int *local_78;
  
  iEnd = (int *)((long)src + srcSize);
  piVar1 = (int *)((long)src + (srcSize - 8));
  pBVar5 = (ms->window).base;
  pBVar6 = (ms->window).dictBase;
  uVar3 = (ms->window).dictLimit;
  uVar4 = (ms->window).lowLimit;
  iStart = pBVar5 + uVar3;
  piVar24 = (int *)(pBVar6 + uVar3);
  ip = (int *)((ulong)(iStart == (BYTE *)src) + (long)src);
  ilimit_w = (int *)((long)src + (srcSize - 0x20));
  local_114 = *rep;
  local_fc = rep[1];
  iVar9 = uVar3 - 1;
  cParams = &ms->cParams;
LAB_00124b30:
  do {
    if (piVar1 <= ip) {
      *rep = local_114;
      rep[1] = local_fc;
      return (long)iEnd - (long)src;
    }
    iVar25 = (int)ip;
    local_a4 = iVar25 - (int)pBVar5;
    uVar10 = (local_a4 - local_114) + 1;
    pBVar17 = pBVar5;
    if (uVar10 < uVar3) {
      pBVar17 = pBVar6;
    }
    if ((uVar4 < uVar10 && 2 < iVar9 - uVar10) &&
       (*(int *)((long)ip + 1) == *(int *)(pBVar17 + uVar10))) {
      piVar20 = iEnd;
      if (uVar10 < uVar3) {
        piVar20 = piVar24;
      }
      sVar14 = ZSTD_count_2segments
                         ((BYTE *)((long)ip + 5),(BYTE *)((long)(pBVar17 + uVar10) + 4),(BYTE *)iEnd
                          ,(BYTE *)piVar20,iStart);
      uVar15 = sVar14 + 4;
    }
    else {
      uVar15 = 0;
    }
    uVar10 = (ms->cParams).minMatch;
    if (uVar10 - 6 < 2) {
      uVar11 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
      pUVar7 = ms->chainTable;
      pBVar17 = (ms->window).base;
      pBVar19 = (ms->window).dictBase;
      uVar10 = (ms->window).dictLimit;
      uVar26 = iVar25 - (int)pBVar17;
      uVar21 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      UVar12 = (ms->window).lowLimit;
      UVar13 = uVar26 - uVar21;
      if (uVar26 - UVar12 <= uVar21) {
        UVar13 = UVar12;
      }
      if (ms->loadedDictEnd != 0) {
        UVar13 = UVar12;
      }
      uVar21 = uVar26 - uVar11;
      if (uVar26 < uVar11) {
        uVar21 = 0;
      }
      iVar25 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      UVar12 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,6);
      uVar22 = 999999999;
      uVar27 = 3;
      while( true ) {
        bVar29 = iVar25 == 0;
        iVar25 = iVar25 + -1;
        if ((UVar12 <= UVar13) || (bVar29)) break;
        if (UVar12 < uVar10) {
          if (pBVar19 + uVar10 < pBVar19 + (ulong)UVar12 + 4) {
LAB_00125af9:
            __assert_fail("match+4 <= dictEnd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x40dd,
                          "size_t ZSTD_HcFindBestMatch_generic(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                         );
          }
          if (*(int *)(pBVar19 + UVar12) == *ip) {
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)(ip + 1),pBVar19 + (ulong)UVar12 + 4,(BYTE *)iEnd,
                                pBVar19 + uVar10,pBVar17 + uVar10);
            uVar16 = sVar14 + 4;
LAB_00124d33:
            if ((uVar27 < uVar16) &&
               (uVar22 = (ulong)((uVar26 + 2) - UVar12), uVar27 = uVar16,
               (int *)((long)ip + uVar16) == iEnd)) break;
          }
        }
        else if ((pBVar17 + UVar12)[uVar27] == *(BYTE *)((long)ip + uVar27)) {
          uVar16 = ZSTD_count((BYTE *)ip,pBVar17 + UVar12,(BYTE *)iEnd);
          goto LAB_00124d33;
        }
        if (UVar12 <= uVar21) break;
        UVar12 = pUVar7[UVar12 & uVar11 - 1];
      }
    }
    else if (uVar10 == 5) {
      uVar11 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
      pUVar7 = ms->chainTable;
      pBVar17 = (ms->window).base;
      pBVar19 = (ms->window).dictBase;
      uVar10 = (ms->window).dictLimit;
      uVar26 = iVar25 - (int)pBVar17;
      uVar21 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      UVar12 = (ms->window).lowLimit;
      UVar13 = uVar26 - uVar21;
      if (uVar26 - UVar12 <= uVar21) {
        UVar13 = UVar12;
      }
      if (ms->loadedDictEnd != 0) {
        UVar13 = UVar12;
      }
      uVar21 = uVar26 - uVar11;
      if (uVar26 < uVar11) {
        uVar21 = 0;
      }
      iVar25 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      UVar12 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,5);
      uVar22 = 999999999;
      uVar27 = 3;
      while( true ) {
        bVar29 = iVar25 == 0;
        iVar25 = iVar25 + -1;
        if ((UVar12 <= UVar13) || (bVar29)) break;
        if (UVar12 < uVar10) {
          if (pBVar19 + uVar10 < pBVar19 + (ulong)UVar12 + 4) goto LAB_00125af9;
          if (*(int *)(pBVar19 + UVar12) == *ip) {
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)(ip + 1),pBVar19 + (ulong)UVar12 + 4,(BYTE *)iEnd,
                                pBVar19 + uVar10,pBVar17 + uVar10);
            uVar16 = sVar14 + 4;
LAB_00124ec0:
            if ((uVar27 < uVar16) &&
               (uVar22 = (ulong)((uVar26 + 2) - UVar12), uVar27 = uVar16,
               (int *)((long)ip + uVar16) == iEnd)) break;
          }
        }
        else if ((pBVar17 + UVar12)[uVar27] == *(BYTE *)((long)ip + uVar27)) {
          uVar16 = ZSTD_count((BYTE *)ip,pBVar17 + UVar12,(BYTE *)iEnd);
          goto LAB_00124ec0;
        }
        if (UVar12 <= uVar21) break;
        UVar12 = pUVar7[UVar12 & uVar11 - 1];
      }
    }
    else {
      uVar11 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
      pUVar7 = ms->chainTable;
      pBVar17 = (ms->window).base;
      pBVar19 = (ms->window).dictBase;
      uVar10 = (ms->window).dictLimit;
      uVar26 = iVar25 - (int)pBVar17;
      uVar21 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      UVar12 = (ms->window).lowLimit;
      UVar13 = uVar26 - uVar21;
      if (uVar26 - UVar12 <= uVar21) {
        UVar13 = UVar12;
      }
      if (ms->loadedDictEnd != 0) {
        UVar13 = UVar12;
      }
      uVar21 = uVar26 - uVar11;
      if (uVar26 < uVar11) {
        uVar21 = 0;
      }
      iVar25 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      UVar12 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,4);
      uVar22 = 999999999;
      uVar27 = 3;
      while( true ) {
        bVar29 = iVar25 == 0;
        iVar25 = iVar25 + -1;
        if ((UVar12 <= UVar13) || (bVar29)) break;
        if (UVar12 < uVar10) {
          if (pBVar19 + uVar10 < pBVar19 + (ulong)UVar12 + 4) goto LAB_00125af9;
          if (*(int *)(pBVar19 + UVar12) == *ip) {
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)(ip + 1),pBVar19 + (ulong)UVar12 + 4,(BYTE *)iEnd,
                                pBVar19 + uVar10,pBVar17 + uVar10);
            uVar16 = sVar14 + 4;
LAB_0012504c:
            if ((uVar27 < uVar16) &&
               (uVar22 = (ulong)((uVar26 + 2) - UVar12), uVar27 = uVar16,
               (int *)((long)ip + uVar16) == iEnd)) break;
          }
        }
        else if ((pBVar17 + UVar12)[uVar27] == *(BYTE *)((long)ip + uVar27)) {
          uVar16 = ZSTD_count((BYTE *)ip,pBVar17 + UVar12,(BYTE *)iEnd);
          goto LAB_0012504c;
        }
        if (UVar12 <= uVar21) break;
        UVar12 = pUVar7[UVar12 & uVar11 - 1];
      }
    }
    uVar16 = uVar15;
    if (uVar15 < uVar27) {
      uVar16 = uVar27;
    }
    if (uVar16 < 4) {
      ip = (int *)((long)ip + ((long)ip - (long)src >> 8) + 1);
      goto LAB_00124b30;
    }
    piVar20 = ip;
    if (uVar27 <= uVar15) {
      uVar22 = 0;
      piVar20 = (int *)((long)ip + 1);
    }
    while (uVar15 = uVar16, local_78 = piVar20, uVar27 = uVar22, ip < piVar1) {
      piVar20 = (int *)((long)ip + 1);
      local_a4 = local_a4 + 1;
      if (uVar27 == 0) {
        uVar27 = 0;
      }
      else {
        uVar10 = local_a4 - local_114;
        pBVar17 = pBVar5;
        if (uVar10 < uVar3) {
          pBVar17 = pBVar6;
        }
        if ((uVar4 < uVar10 && 2 < iVar9 - uVar10) && (*piVar20 == *(int *)(pBVar17 + uVar10))) {
          mEnd = iEnd;
          if (uVar10 < uVar3) {
            mEnd = piVar24;
          }
          sVar14 = ZSTD_count_2segments
                             ((BYTE *)((long)ip + 5),(BYTE *)((long)(pBVar17 + uVar10) + 4),
                              (BYTE *)iEnd,(BYTE *)mEnd,iStart);
          UVar12 = ZSTD_highbit32((int)uVar27 + 1);
          if ((sVar14 < 0xfffffffffffffffc) &&
             ((int)(((int)uVar15 * 3 - UVar12) + 1) < (int)(sVar14 + 4) * 3)) {
            uVar27 = 0;
            local_78 = piVar20;
            uVar15 = sVar14 + 4;
          }
        }
      }
      uVar10 = (ms->cParams).minMatch;
      iVar25 = (int)piVar20;
      if (uVar10 - 6 < 2) {
        uVar11 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar7 = ms->chainTable;
        pBVar17 = (ms->window).base;
        pBVar19 = (ms->window).dictBase;
        uVar10 = (ms->window).dictLimit;
        uVar21 = iVar25 - (int)pBVar17;
        uVar26 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        UVar12 = (ms->window).lowLimit;
        UVar13 = uVar21 - uVar26;
        if (uVar21 - UVar12 <= uVar26) {
          UVar13 = UVar12;
        }
        if (ms->loadedDictEnd != 0) {
          UVar13 = UVar12;
        }
        uVar26 = uVar21 - uVar11;
        if (uVar21 < uVar11) {
          uVar26 = 0;
        }
        iVar25 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar12 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)piVar20,6);
        uVar22 = 999999999;
        uVar16 = 3;
        while( true ) {
          bVar29 = iVar25 == 0;
          iVar25 = iVar25 + -1;
          if ((UVar12 <= UVar13) || (bVar29)) break;
          if (UVar12 < uVar10) {
            if (pBVar19 + uVar10 < pBVar19 + (ulong)UVar12 + 4) goto LAB_00125af9;
            if (*(int *)(pBVar19 + UVar12) == *piVar20) {
              sVar14 = ZSTD_count_2segments
                                 ((BYTE *)((long)ip + 5),pBVar19 + (ulong)UVar12 + 4,(BYTE *)iEnd,
                                  pBVar19 + uVar10,pBVar17 + uVar10);
              sVar14 = sVar14 + 4;
LAB_0012533a:
              if ((uVar16 < sVar14) &&
                 (uVar22 = (ulong)((uVar21 + 2) - UVar12), uVar16 = sVar14,
                 (int *)((long)piVar20 + sVar14) == iEnd)) break;
            }
          }
          else if ((pBVar17 + UVar12)[uVar16] == *(BYTE *)((long)piVar20 + uVar16)) {
            sVar14 = ZSTD_count((BYTE *)piVar20,pBVar17 + UVar12,(BYTE *)iEnd);
            goto LAB_0012533a;
          }
          if (UVar12 <= uVar26) break;
          UVar12 = pUVar7[UVar12 & uVar11 - 1];
        }
      }
      else if (uVar10 == 5) {
        uVar11 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar7 = ms->chainTable;
        pBVar17 = (ms->window).base;
        pBVar19 = (ms->window).dictBase;
        uVar10 = (ms->window).dictLimit;
        uVar21 = iVar25 - (int)pBVar17;
        uVar26 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        UVar12 = (ms->window).lowLimit;
        UVar13 = uVar21 - uVar26;
        if (uVar21 - UVar12 <= uVar26) {
          UVar13 = UVar12;
        }
        if (ms->loadedDictEnd != 0) {
          UVar13 = UVar12;
        }
        uVar26 = uVar21 - uVar11;
        if (uVar21 < uVar11) {
          uVar26 = 0;
        }
        iVar25 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar12 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)piVar20,5);
        uVar22 = 999999999;
        uVar16 = 3;
        while( true ) {
          bVar29 = iVar25 == 0;
          iVar25 = iVar25 + -1;
          if ((UVar12 <= UVar13) || (bVar29)) break;
          if (UVar12 < uVar10) {
            if (pBVar19 + uVar10 < pBVar19 + (ulong)UVar12 + 4) goto LAB_00125af9;
            if (*(int *)(pBVar19 + UVar12) == *piVar20) {
              sVar14 = ZSTD_count_2segments
                                 ((BYTE *)((long)ip + 5),pBVar19 + (ulong)UVar12 + 4,(BYTE *)iEnd,
                                  pBVar19 + uVar10,pBVar17 + uVar10);
              sVar14 = sVar14 + 4;
LAB_001254d0:
              if ((uVar16 < sVar14) &&
                 (uVar22 = (ulong)((uVar21 + 2) - UVar12), uVar16 = sVar14,
                 (int *)((long)piVar20 + sVar14) == iEnd)) break;
            }
          }
          else if ((pBVar17 + UVar12)[uVar16] == *(BYTE *)((long)piVar20 + uVar16)) {
            sVar14 = ZSTD_count((BYTE *)piVar20,pBVar17 + UVar12,(BYTE *)iEnd);
            goto LAB_001254d0;
          }
          if (UVar12 <= uVar26) break;
          UVar12 = pUVar7[UVar12 & uVar11 - 1];
        }
      }
      else {
        uVar11 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar7 = ms->chainTable;
        pBVar17 = (ms->window).base;
        pBVar19 = (ms->window).dictBase;
        uVar10 = (ms->window).dictLimit;
        uVar21 = iVar25 - (int)pBVar17;
        uVar26 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        UVar12 = (ms->window).lowLimit;
        UVar13 = uVar21 - uVar26;
        if (uVar21 - UVar12 <= uVar26) {
          UVar13 = UVar12;
        }
        if (ms->loadedDictEnd != 0) {
          UVar13 = UVar12;
        }
        uVar26 = uVar21 - uVar11;
        if (uVar21 < uVar11) {
          uVar26 = 0;
        }
        iVar25 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar12 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)piVar20,4);
        uVar22 = 999999999;
        uVar16 = 3;
        while( true ) {
          bVar29 = iVar25 == 0;
          iVar25 = iVar25 + -1;
          if ((UVar12 <= UVar13) || (bVar29)) break;
          if (UVar12 < uVar10) {
            if (pBVar19 + uVar10 < pBVar19 + (ulong)UVar12 + 4) goto LAB_00125af9;
            if (*(int *)(pBVar19 + UVar12) == *piVar20) {
              sVar14 = ZSTD_count_2segments
                                 ((BYTE *)((long)ip + 5),pBVar19 + (ulong)UVar12 + 4,(BYTE *)iEnd,
                                  pBVar19 + uVar10,pBVar17 + uVar10);
              sVar14 = sVar14 + 4;
LAB_00125665:
              if ((uVar16 < sVar14) &&
                 (uVar22 = (ulong)((uVar21 + 2) - UVar12), uVar16 = sVar14,
                 (int *)((long)piVar20 + sVar14) == iEnd)) break;
            }
          }
          else if ((pBVar17 + UVar12)[uVar16] == *(BYTE *)((long)piVar20 + uVar16)) {
            sVar14 = ZSTD_count((BYTE *)piVar20,pBVar17 + UVar12,(BYTE *)iEnd);
            goto LAB_00125665;
          }
          if (UVar12 <= uVar26) break;
          UVar12 = pUVar7[UVar12 & uVar11 - 1];
        }
      }
      UVar12 = ZSTD_highbit32((int)uVar22 + 1);
      UVar13 = ZSTD_highbit32((int)uVar27 + 1);
      if ((uVar16 < 4) ||
         (ip = piVar20, (int)((int)uVar16 * 4 - UVar12) <= (int)(((int)uVar15 * 4 - UVar13) + 4)))
      break;
    }
    if (uVar27 == 0) {
      UVar12 = 1;
    }
    else {
      pBVar18 = (BYTE *)((long)local_78 + (-(long)pBVar5 - uVar27) + 2);
      pBVar19 = iStart;
      pBVar17 = pBVar5;
      if ((uint)pBVar18 < uVar3) {
        pBVar19 = pBVar6 + uVar4;
        pBVar17 = pBVar6;
      }
      pBVar17 = pBVar17 + ((ulong)pBVar18 & 0xffffffff);
      for (; ((src < local_78 && (pBVar19 < pBVar17)) &&
             (*(BYTE *)((long)local_78 + -1) == pBVar17[-1]));
          local_78 = (int *)((long)local_78 + -1)) {
        pBVar17 = pBVar17 + -1;
        uVar15 = uVar15 + 1;
      }
      UVar12 = (int)uVar27 + 1;
      local_fc = local_114;
      local_114 = (int)uVar27 - 2;
    }
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_00125b56:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2038,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < seqStore->maxNbLit) {
LAB_00125b75:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203a,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar27 = (long)local_78 - (long)src;
    pBVar17 = seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < pBVar17 + uVar27) {
LAB_00125b37:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (iEnd < local_78) {
LAB_00125b18:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203c,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (ilimit_w < local_78) {
      ZSTD_safecopyLiterals(pBVar17,(BYTE *)src,(BYTE *)local_78,(BYTE *)ilimit_w);
LAB_0012583a:
      seqStore->lit = seqStore->lit + uVar27;
      if (0xffff < uVar27) {
        if (seqStore->longLengthID != 0) {
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x204d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthID = 1;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar8 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar17 = *src;
      *(undefined8 *)(pBVar17 + 8) = uVar8;
      pBVar17 = seqStore->lit;
      if (0x10 < uVar27) {
        lVar23 = (long)(pBVar17 + 0x10) - ((long)src + 0x10);
        if (lVar23 < 8) {
          if (-0x10 < lVar23) {
            __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1268,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
        }
        else if (0xffffffffffffffe0 < lVar23 - 0x10U) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x1270,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar8 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar17 + 0x18) = uVar8;
        if (0x20 < (long)uVar27) {
          lVar23 = 0;
          do {
            puVar2 = (undefined8 *)((long)src + lVar23 + 0x20);
            uVar8 = puVar2[1];
            pBVar19 = pBVar17 + lVar23 + 0x20;
            *(undefined8 *)pBVar19 = *puVar2;
            *(undefined8 *)(pBVar19 + 8) = uVar8;
            puVar2 = (undefined8 *)((long)src + lVar23 + 0x30);
            uVar8 = puVar2[1];
            *(undefined8 *)(pBVar19 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar19 + 0x18) = uVar8;
            lVar23 = lVar23 + 0x20;
          } while (pBVar19 + 0x20 < pBVar17 + uVar27);
        }
        goto LAB_0012583a;
      }
      seqStore->lit = pBVar17 + uVar27;
    }
    psVar28 = seqStore->sequences;
    psVar28->litLength = (U16)uVar27;
    psVar28->offset = UVar12;
    if (0xffff < uVar15 - 3) {
      if (seqStore->longLengthID != 0) {
LAB_00125b94:
        __assert_fail("seqStorePtr->longLengthID == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2058,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthID = 2;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar28->matchLength = (U16)(uVar15 - 3);
    psVar28 = psVar28 + 1;
    seqStore->sequences = psVar28;
    UVar12 = local_fc;
    for (ip = (int *)((long)local_78 + uVar15); local_fc = UVar12, src = ip, ip <= piVar1;
        ip = (int *)((long)ip + sVar14 + 4)) {
      uVar10 = (uint)((long)ip - (long)(pBVar5 + local_fc));
      pBVar17 = pBVar5;
      if (uVar10 < uVar3) {
        pBVar17 = pBVar6;
      }
      if (((uVar10 <= uVar4) || (iVar9 - uVar10 < 3)) ||
         (*ip != *(int *)(pBVar17 + ((long)ip - (long)(pBVar5 + local_fc) & 0xffffffff)))) break;
      piVar20 = iEnd;
      if (uVar10 < uVar3) {
        piVar20 = piVar24;
      }
      sVar14 = ZSTD_count_2segments
                         ((BYTE *)(ip + 1),
                          (BYTE *)((long)(pBVar17 +
                                         ((long)ip - (long)(pBVar5 + local_fc) & 0xffffffff)) + 4),
                          (BYTE *)iEnd,(BYTE *)piVar20,iStart);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar28 - (long)seqStore->sequencesStart >> 3))
      goto LAB_00125b56;
      if (0x20000 < seqStore->maxNbLit) goto LAB_00125b75;
      pBVar17 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar17) goto LAB_00125b37;
      if (iEnd < ip) goto LAB_00125b18;
      if (ilimit_w < ip) {
        ZSTD_safecopyLiterals(pBVar17,(BYTE *)ip,(BYTE *)ip,(BYTE *)ilimit_w);
      }
      else {
        uVar8 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar17 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar17 + 8) = uVar8;
      }
      psVar28 = seqStore->sequences;
      psVar28->litLength = 0;
      psVar28->offset = 1;
      if (0xffff < sVar14 + 1) {
        if (seqStore->longLengthID != 0) goto LAB_00125b94;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar28->matchLength = (U16)(sVar14 + 1);
      psVar28 = psVar28 + 1;
      seqStore->sequences = psVar28;
      UVar12 = local_114;
      local_114 = local_fc;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1);
}